

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<long_const&,pbrt::Point2<int>const&,pbrt::Point2<int>const&,int_const&,int_const&>
               (string *s,char *fmt,long *v,Point2<int> *args,Point2<int> *args_1,int *args_2,
               int *args_3)

{
  long lVar1;
  ulong uVar2;
  long *in_RDX;
  string *in_RDI;
  Point2<int> *in_R9;
  byte bVar3;
  byte bVar4;
  undefined1 uVar5;
  Point2<int> *in_stack_00000008;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  long *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  undefined1 *puVar6;
  string *in_stack_fffffffffffffd80;
  char **in_stack_fffffffffffffd88;
  char **in_stack_fffffffffffffd90;
  int *in_stack_fffffffffffffd98;
  string local_258 [32];
  undefined8 local_238;
  string local_230 [32];
  stringstream local_210 [8];
  char *in_stack_fffffffffffffdf8;
  undefined1 local_200 [4];
  int in_stack_fffffffffffffe04;
  char *in_stack_fffffffffffffe08;
  LogLevel in_stack_fffffffffffffe14;
  string local_88 [16];
  int *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Point2<int> *in_stack_ffffffffffffffa0;
  undefined5 in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  
  copyToFormatString(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffffb0,0x2a);
  bVar3 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffffb0,0x73);
  bVar4 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffffb0,100);
  uVar5 = lVar1 != -1;
  if ((bVar3 & 1) == 0) {
    if ((bool)uVar5) {
      puVar6 = &stack0xffffffffffffffb0;
      uVar2 = std::__cxx11::string::find((char)puVar6,100);
      IntegerFormatTrait<long>::fmt();
      std::__cxx11::string::replace((ulong)puVar6,uVar2,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<long_const&>((char *)in_stack_fffffffffffffd98,(long *)in_stack_fffffffffffffd90);
      std::__cxx11::string::operator+=(in_RDI,local_88);
      std::__cxx11::string::~string(local_88);
    }
    else if ((bVar4 & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                 in_stack_fffffffffffffdf8);
      }
      std::__cxx11::string::c_str();
      formatOne<long_const&>((char *)in_stack_fffffffffffffd98,(long *)in_stack_fffffffffffffd90);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd88);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd88);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_210);
      std::ostream::operator<<(local_200,*in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      local_238 = std::__cxx11::string::c_str();
      formatOne<char_const*>((char *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      std::__cxx11::string::operator+=(in_RDI,local_230);
      std::__cxx11::string::~string(local_230);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::stringstream::~stringstream(local_210);
    }
    stringPrintfRecursive<pbrt::Point2<int>const&,pbrt::Point2<int>const&,int_const&,int_const&>
              (in_stack_ffffffffffffffb0,
               (char *)CONCAT17(bVar3,CONCAT16(bVar4,CONCAT15(uVar5,in_stack_ffffffffffffffa8))),
               in_stack_ffffffffffffffa0,
               (Point2<int> *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    stringPrintfRecursiveWithPrecision<long_const&,pbrt::Point2<int>const&,pbrt::Point2<int>const&,int_const&,int_const&>
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
               in_stack_fffffffffffffd68,in_stack_00000008,in_R9,(int *)in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd98);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}